

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

cTValue * lj_ir_k64_find(jit_State *J,uint64_t u64)

{
  long lVar1;
  MRef *pMVar2;
  MRef *pMVar3;
  long lVar4;
  uint uVar5;
  
  pMVar2 = &J->k64;
  pMVar3 = (MRef *)0x0;
  do {
    pMVar2 = (MRef *)(ulong)pMVar2->ptr32;
    if (pMVar2 == (MRef *)0x0) {
      if ((pMVar3 == (MRef *)0x0) || (uVar5 = (((TValue *)(pMVar3 + 1))->u32).lo, 0xf < uVar5)) {
        uVar5 = 0;
        pMVar2 = (MRef *)lj_mem_realloc(J->L,(void *)0x0,0,0x88);
        *(undefined8 *)pMVar2 = 0;
        if (pMVar3 == (MRef *)0x0) {
          (J->k64).ptr32 = (uint32_t)pMVar2;
          pMVar3 = pMVar2;
        }
        else {
          pMVar3->ptr32 = (uint32_t)pMVar2;
          pMVar3 = pMVar2;
        }
      }
      (((TValue *)(pMVar3 + 1))->u32).lo = uVar5 + 1;
      ((cTValue *)(pMVar3 + (ulong)uVar5 * 2 + 2))->u64 = u64;
      return (cTValue *)(pMVar3 + (ulong)uVar5 * 2 + 2);
    }
    lVar1 = 0;
    while (lVar4 = lVar1, pMVar3 = pMVar2, (ulong)(((TValue *)(pMVar2 + 1))->u32).lo << 3 != lVar4)
    {
      lVar1 = lVar4 + 8;
      if (*(uint64_t *)((long)(pMVar2 + 2) + lVar4) == u64) {
        return (cTValue *)((long)(pMVar2 + 2) + lVar4);
      }
    }
  } while( true );
}

Assistant:

cTValue *lj_ir_k64_find(jit_State *J, uint64_t u64)
{
  K64Array *k, *kp = NULL;
  TValue *ntv;
  MSize idx;
  /* Search for the constant in the whole chain of arrays. */
  for (k = mref(J->k64, K64Array); k; k = mref(k->next, K64Array)) {
    kp = k;  /* Remember previous element in list. */
    for (idx = 0; idx < k->numk; idx++) {  /* Search one array. */
      TValue *tv = &k->k[idx];
      if (tv->u64 == u64)  /* Needed for +-0/NaN/absmask. */
	return tv;
    }
  }
  /* Constant was not found, need to add it. */
  if (!(kp && kp->numk < LJ_MIN_K64SZ)) {  /* Allocate a new array. */
    K64Array *kn = lj_mem_newt(J->L, sizeof(K64Array), K64Array);
    setmref(kn->next, NULL);
    kn->numk = 0;
    if (kp)
      setmref(kp->next, kn);  /* Chain to the end of the list. */
    else
      setmref(J->k64, kn);  /* Link first array. */
    kp = kn;
  }
  ntv = &kp->k[kp->numk++];  /* Add to current array. */
  ntv->u64 = u64;
  return ntv;
}